

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_read_session_ticket(SSL_HANDSHAKE *hs)

{
  SSL *ssl_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  pointer psVar4;
  uint8_t *d;
  uchar *md;
  Span<const_unsigned_char> in;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_78;
  uint32_t local_6c;
  undefined1 local_68 [4];
  uint32_t ticket_lifetime_hint;
  CBS ticket;
  CBS new_session_ticket;
  SSLMessage msg;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if ((*(uint *)&hs->field_0x6c8 >> 0x10 & 1) == 0) {
    hs->state = 0x12;
    hs_local._4_4_ = ssl_hs_read_change_cipher_spec;
  }
  else {
    bVar1 = (*ssl_00->method->get_message)(ssl_00,(SSLMessage *)&new_session_ticket.len);
    if (bVar1) {
      bVar1 = ssl_check_message_type(ssl_00,(SSLMessage *)&new_session_ticket.len,4);
      if ((bVar1) && (bVar1 = ssl_hash_message(hs,(SSLMessage *)&new_session_ticket.len), bVar1)) {
        iVar2 = CBS_get_u32((CBS *)&ticket.len,&local_6c);
        if (((iVar2 == 0) ||
            (iVar2 = CBS_get_u16_length_prefixed((CBS *)&ticket.len,(CBS *)local_68), iVar2 == 0))
           || (sVar3 = CBS_len((CBS *)&ticket.len), sVar3 != 0)) {
          ssl_send_alert(ssl_00,2,0x32);
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                        ,0x6a7);
          hs_local._4_4_ = ssl_hs_error;
        }
        else {
          sVar3 = CBS_len((CBS *)local_68);
          if (sVar3 == 0) {
            *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfffeffff;
            (*ssl_00->method->next_message)(ssl_00);
            hs->state = 0x12;
            hs_local._4_4_ = ssl_hs_read_change_cipher_spec;
          }
          else {
            bVar1 = std::operator!=(&ssl_00->session,(nullptr_t)0x0);
            if (bVar1) {
              bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->new_session);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                __assert_fail("!hs->new_session",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                              ,0x6b9,
                              "enum ssl_hs_wait_t bssl::do_read_session_ticket(SSL_HANDSHAKE *)");
              }
              psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                 (&ssl_00->session);
              SSL_SESSION_dup((bssl *)&local_78,psVar4,2);
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
                        (&hs->new_session,&local_78);
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_78);
              bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->new_session);
              if (!bVar1) {
                return ssl_hs_error;
              }
            }
            psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&hs->new_session)
            ;
            ssl_session_rebase_time(ssl_00,psVar4);
            psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                               (&hs->new_session);
            in = cbs_st::operator_cast_to_Span((cbs_st *)local_68);
            bVar1 = Array<unsigned_char>::CopyFrom(&psVar4->ticket,in);
            if (bVar1) {
              psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                 (&hs->new_session);
              psVar4->ticket_lifetime_hint = local_6c;
              psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                 (&hs->new_session);
              InplaceVector<unsigned_char,_32UL>::ResizeForOverwrite(&psVar4->session_id,0x20);
              d = CBS_data((CBS *)local_68);
              sVar3 = CBS_len((CBS *)local_68);
              psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                 (&hs->new_session);
              md = InplaceVector<unsigned_char,_32UL>::data(&psVar4->session_id);
              SHA256(d,sVar3,md);
              (*ssl_00->method->next_message)(ssl_00);
              hs->state = 0x12;
              hs_local._4_4_ = ssl_hs_read_change_cipher_spec;
            }
            else {
              hs_local._4_4_ = ssl_hs_error;
            }
          }
        }
      }
      else {
        hs_local._4_4_ = ssl_hs_error;
      }
    }
    else {
      hs_local._4_4_ = ssl_hs_read_message;
    }
  }
  return hs_local._4_4_;
}

Assistant:

static enum ssl_hs_wait_t do_read_session_ticket(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;

  if (!hs->ticket_expected) {
    hs->state = state_process_change_cipher_spec;
    return ssl_hs_read_change_cipher_spec;
  }

  SSLMessage msg;
  if (!ssl->method->get_message(ssl, &msg)) {
    return ssl_hs_read_message;
  }

  if (!ssl_check_message_type(ssl, msg, SSL3_MT_NEW_SESSION_TICKET) ||
      !ssl_hash_message(hs, msg)) {
    return ssl_hs_error;
  }

  CBS new_session_ticket = msg.body, ticket;
  uint32_t ticket_lifetime_hint;
  if (!CBS_get_u32(&new_session_ticket, &ticket_lifetime_hint) ||
      !CBS_get_u16_length_prefixed(&new_session_ticket, &ticket) ||
      CBS_len(&new_session_ticket) != 0) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return ssl_hs_error;
  }

  if (CBS_len(&ticket) == 0) {
    // RFC 5077 allows a server to change its mind and send no ticket after
    // negotiating the extension. The value of |ticket_expected| is checked in
    // |ssl_update_cache| so is cleared here to avoid an unnecessary update.
    hs->ticket_expected = false;
    ssl->method->next_message(ssl);
    hs->state = state_process_change_cipher_spec;
    return ssl_hs_read_change_cipher_spec;
  }

  if (ssl->session != nullptr) {
    // The server is sending a new ticket for an existing session. Sessions are
    // immutable once established, so duplicate all but the ticket of the
    // existing session.
    assert(!hs->new_session);
    hs->new_session =
        SSL_SESSION_dup(ssl->session.get(), SSL_SESSION_INCLUDE_NONAUTH);
    if (!hs->new_session) {
      return ssl_hs_error;
    }
  }

  // |ticket_lifetime_hint| is measured from when the ticket was issued.
  ssl_session_rebase_time(ssl, hs->new_session.get());

  if (!hs->new_session->ticket.CopyFrom(ticket)) {
    return ssl_hs_error;
  }
  hs->new_session->ticket_lifetime_hint = ticket_lifetime_hint;

  // Historically, OpenSSL filled in fake session IDs for ticket-based sessions.
  // TODO(davidben): Are external callers relying on this? Try removing this.
  hs->new_session->session_id.ResizeForOverwrite(SHA256_DIGEST_LENGTH);
  SHA256(CBS_data(&ticket), CBS_len(&ticket),
         hs->new_session->session_id.data());

  ssl->method->next_message(ssl);
  hs->state = state_process_change_cipher_spec;
  return ssl_hs_read_change_cipher_spec;
}